

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushFont(ImFont *font)

{
  ImGuiContext *pIVar1;
  ImFont *in_RDI;
  ImFont *local_18;
  
  pIVar1 = GImGui;
  local_18 = in_RDI;
  if (in_RDI == (ImFont *)0x0) {
    local_18 = GetDefaultFont();
  }
  SetCurrentFont(local_18);
  ImVector<ImFont_*>::push_back(&pIVar1->FontStack,&local_18);
  ImDrawList::PushTextureID(pIVar1->CurrentWindow->DrawList,local_18->ContainerAtlas->TexID);
  return;
}

Assistant:

void ImGui::PushFont(ImFont* font)
{
    ImGuiContext& g = *GImGui;
    if (!font)
        font = GetDefaultFont();
    SetCurrentFont(font);
    g.FontStack.push_back(font);
    g.CurrentWindow->DrawList->PushTextureID(font->ContainerAtlas->TexID);
}